

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng_state_init(LodePNGState *state)

{
  (state->decoder).max_text_size = 0x1000000;
  (state->decoder).max_icc_size = 0x1000000;
  (state->decoder).zlibsettings.ignore_adler32 = 0;
  (state->decoder).zlibsettings.ignore_nlen = 0;
  (state->decoder).zlibsettings.max_output_size = 0;
  (state->decoder).zlibsettings.custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  (state->decoder).zlibsettings.custom_inflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)0x0;
  (state->decoder).zlibsettings.custom_context = (void *)0x0;
  (state->decoder).ignore_crc = 0;
  (state->decoder).ignore_critical = 0;
  (state->decoder).ignore_end = 0;
  (state->decoder).color_convert = 1;
  (state->decoder).read_text_chunks = 1;
  (state->decoder).remember_unknown_chunks = 0;
  (state->encoder).zlibsettings.btype = 2;
  (state->encoder).zlibsettings.use_lz77 = 1;
  (state->encoder).zlibsettings.windowsize = 0x800;
  (state->encoder).zlibsettings.minmatch = 3;
  (state->encoder).zlibsettings.nicematch = 0x80;
  (state->encoder).zlibsettings.lazymatching = 1;
  (state->encoder).zlibsettings.custom_zlib =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  (state->encoder).zlibsettings.custom_deflate =
       (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
  (state->encoder).zlibsettings.custom_context = (void *)0x0;
  (state->encoder).filter_strategy = LFS_MINSUM;
  (state->encoder).auto_convert = 1;
  (state->encoder).filter_palette_zero = 1;
  (state->encoder).predefined_filters = (uchar *)0x0;
  (state->encoder).force_palette = 0;
  (state->encoder).add_id = 0;
  (state->encoder).text_compression = 1;
  (state->info_raw).key_defined = 0;
  (state->info_raw).key_r = 0;
  (state->info_raw).key_g = 0;
  (state->info_raw).key_b = 0;
  (state->info_raw).colortype = LCT_RGBA;
  (state->info_raw).bitdepth = 8;
  (state->info_raw).palette = (uchar *)0x0;
  (state->info_raw).palettesize = 0;
  (state->info_png).color.key_defined = 0;
  (state->info_png).color.key_r = 0;
  (state->info_png).color.key_g = 0;
  (state->info_png).color.key_b = 0;
  (state->info_png).color.colortype = LCT_RGBA;
  (state->info_png).color.bitdepth = 8;
  (state->info_png).color.palette = (uchar *)0x0;
  (state->info_png).color.palettesize = 0;
  (state->info_png).interlace_method = 0;
  (state->info_png).compression_method = 0;
  (state->info_png).filter_method = 0;
  (state->info_png).phys_defined = 0;
  (state->info_png).gama_defined = 0;
  (state->info_png).chrm_defined = 0;
  (state->info_png).srgb_defined = 0;
  (state->info_png).unknown_chunks_data[0] = (uchar *)0x0;
  (state->info_png).unknown_chunks_data[1] = (uchar *)0x0;
  (state->info_png).unknown_chunks_data[2] = (uchar *)0x0;
  (state->info_png).unknown_chunks_size[0] = 0;
  (state->info_png).unknown_chunks_size[1] = 0;
  (state->info_png).unknown_chunks_size[2] = 0;
  (state->info_png).background_defined = 0;
  (state->info_png).background_r = 0;
  (state->info_png).background_g = 0;
  (state->info_png).background_b = 0;
  (state->info_png).text_num = 0;
  (state->info_png).text_keys = (char **)0x0;
  (state->info_png).text_strings = (char **)0x0;
  (state->info_png).itext_num = 0;
  (state->info_png).itext_keys = (char **)0x0;
  (state->info_png).itext_langtags = (char **)0x0;
  (state->info_png).itext_transkeys = (char **)0x0;
  (state->info_png).itext_strings = (char **)0x0;
  (state->info_png).exif_defined = 0;
  (state->info_png).exif = (uchar *)0x0;
  (state->info_png).exif_size = 0;
  (state->info_png).time_defined = 0;
  *(undefined4 *)((long)&(state->info_png).iccp_profile + 4) = 0;
  *(undefined8 *)&(state->info_png).iccp_defined = 0;
  *(undefined8 *)((long)&(state->info_png).iccp_name + 4) = 0;
  (state->info_png).sbit_r = 0;
  (state->info_png).sbit_g = 0;
  (state->info_png).sbit_b = 0;
  (state->info_png).sbit_a = 0;
  (state->info_png).clli_defined = 0;
  (state->info_png).clli_max_cll = 0;
  (state->info_png).clli_max_fall = 0;
  (state->info_png).sbit_defined = 0;
  (state->info_png).mdcv_white_x = 0;
  (state->info_png).mdcv_white_y = 0;
  (state->info_png).mdcv_max_luminance = 0;
  (state->info_png).mdcv_min_luminance = 0;
  (state->info_png).mdcv_green_x = 0;
  (state->info_png).mdcv_green_y = 0;
  (state->info_png).mdcv_blue_x = 0;
  (state->info_png).mdcv_blue_y = 0;
  (state->info_png).cicp_video_full_range_flag = 0;
  (state->info_png).mdcv_defined = 0;
  (state->info_png).mdcv_red_x = 0;
  (state->info_png).mdcv_red_y = 0;
  (state->info_png).cicp_defined = 0;
  (state->info_png).cicp_color_primaries = 0;
  (state->info_png).cicp_transfer_function = 0;
  (state->info_png).cicp_matrix_coefficients = 0;
  state->error = 1;
  return;
}

Assistant:

void lodepng_state_init(LodePNGState* state) {
#ifdef LODEPNG_COMPILE_DECODER
  lodepng_decoder_settings_init(&state->decoder);
#endif /*LODEPNG_COMPILE_DECODER*/
#ifdef LODEPNG_COMPILE_ENCODER
  lodepng_encoder_settings_init(&state->encoder);
#endif /*LODEPNG_COMPILE_ENCODER*/
  lodepng_color_mode_init(&state->info_raw);
  lodepng_info_init(&state->info_png);
  state->error = 1;
}